

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicProfileStorage.cpp
# Opt level: O1

bool DynamicProfileStorage::CreateCacheCatalog(void)

{
  code *pcVar1;
  bool bVar2;
  bool bVar3;
  undefined4 *puVar4;
  int local_2c;
  undefined1 auStack_28 [8];
  DynamicProfileStorageReaderWriter catalogFile;
  
  if (!enabled) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/DynamicProfileStorage.cpp"
                       ,0x318,"(enabled)","enabled");
    if (!bVar2) goto LAB_0097ec36;
    *puVar4 = 0;
  }
  if (useCacheDir == false) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/DynamicProfileStorage.cpp"
                       ,0x319,"(useCacheDir)","useCacheDir");
    if (!bVar2) goto LAB_0097ec36;
    *puVar4 = 0;
  }
  if (locked == false) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/DynamicProfileStorage.cpp"
                       ,0x31a,"(locked)","locked");
    if (!bVar2) {
LAB_0097ec36:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  nextFileId = 0;
  creationTime = time((time_t *)0x0);
  auStack_28 = (undefined1  [8])0x0;
  catalogFile.filename = (char16 *)0x0;
  bVar2 = DynamicProfileStorageReaderWriter::Init
                    ((DynamicProfileStorageReaderWriter *)auStack_28,catalogFilename,L"wb",true,
                     (errno_t *)0x0);
  if (bVar2) {
    bVar2 = DynamicProfileStorageReaderWriter::WriteArray<unsigned_int_const>
                      ((DynamicProfileStorageReaderWriter *)auStack_28,&MagicNumber,1);
    if (bVar2) {
      bVar2 = DynamicProfileStorageReaderWriter::WriteArray<unsigned_int_const>
                        ((DynamicProfileStorageReaderWriter *)auStack_28,&FileFormatVersion,1);
      if (bVar2) {
        bVar2 = DynamicProfileStorageReaderWriter::WriteArray<long_const>
                          ((DynamicProfileStorageReaderWriter *)auStack_28,&creationTime,1);
        if (bVar2) {
          local_2c = 0;
          bVar2 = DynamicProfileStorageReaderWriter::WriteArray<int_const>
                            ((DynamicProfileStorageReaderWriter *)auStack_28,&local_2c,1);
          if (bVar2) {
            lastOffset = DynamicProfileStorageReaderWriter::Size
                                   ((DynamicProfileStorageReaderWriter *)auStack_28);
            ClearInfoMap(true);
            DynamicProfileStorageReaderWriter::Close
                      ((DynamicProfileStorageReaderWriter *)auStack_28,false);
            bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_015cd718,DynamicProfileStoragePhase);
            bVar2 = true;
            if (bVar3) {
              Output::Print(L"TRACE: DynamicProfileStorage: Cache directory catalog created: \'%s\'\n"
                            ,catalogFilename);
              Output::Flush();
            }
            goto LAB_0097ec24;
          }
        }
      }
    }
  }
  DisableCacheDir();
  Output::Print(L"ERROR: DynamicProfileStorage: Unable to create cache catalog\n");
  Output::Flush();
  bVar2 = false;
LAB_0097ec24:
  DynamicProfileStorageReaderWriter::~DynamicProfileStorageReaderWriter
            ((DynamicProfileStorageReaderWriter *)auStack_28);
  return bVar2;
}

Assistant:

bool DynamicProfileStorage::CreateCacheCatalog()
{
    AssertOrFailFast(enabled);
    AssertOrFailFast(useCacheDir);
    AssertOrFailFast(locked);
    nextFileId = 0;
    creationTime = GetCreationTime();
    DynamicProfileStorageReaderWriter catalogFile;
    if (!catalogFile.Init(catalogFilename, _u("wb"), true)
        || !catalogFile.Write(MagicNumber)
        || !catalogFile.Write(FileFormatVersion)
        || !catalogFile.Write(creationTime)
        || !catalogFile.Write(0)) // count
    {
        DisableCacheDir();
        Output::Print(_u("ERROR: DynamicProfileStorage: Unable to create cache catalog\n"));
        Output::Flush();
        return false;
    }
    lastOffset = catalogFile.Size();
    ClearInfoMap(true);
    catalogFile.Close();

#if DBG_DUMP
    if (DynamicProfileStorage::DoTrace())
    {
        Output::Print(_u("TRACE: DynamicProfileStorage: Cache directory catalog created: '%s'\n"), catalogFilename);
        Output::Flush();
    }
#endif
    return true;
}